

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O0

REF_STATUS
ref_cell_add_many_global
          (REF_CELL ref_cell,REF_NODE ref_node,REF_INT n,REF_GLOB *c2n,REF_INT *part,
          REF_INT exclude_part_id)

{
  uint uVar1;
  clock_t cVar2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rxs;
  REF_STATUS ref_private_macro_code_rsb;
  REF_STATUS ref_private_macro_code_rss;
  clock_t cell_toc;
  clock_t node_toc;
  clock_t tic;
  REF_INT local_d8;
  REF_INT new_cell;
  REF_INT local_nodes [27];
  int local_60;
  uint local_5c;
  REF_INT local;
  REF_INT cell;
  REF_INT node;
  REF_INT nnode;
  REF_GLOB *global;
  REF_MPI ref_mpi;
  REF_INT *pRStack_38;
  REF_INT exclude_part_id_local;
  REF_INT *part_local;
  REF_GLOB *c2n_local;
  REF_NODE pRStack_20;
  REF_INT n_local;
  REF_NODE ref_node_local;
  REF_CELL ref_cell_local;
  
  global = (REF_GLOB *)ref_node->ref_mpi;
  node_toc = 0;
  cell_toc = 0;
  _ref_private_macro_code_rsb = 0;
  ref_mpi._4_4_ = exclude_part_id;
  pRStack_38 = part;
  part_local = (REF_INT *)c2n;
  c2n_local._4_4_ = n;
  pRStack_20 = ref_node;
  ref_node_local = (REF_NODE)ref_cell;
  if (10 < ((REF_MPI)global)->timing) {
    node_toc = clock();
  }
  if ((int)(*(int *)&ref_node_local->field_0xc * c2n_local._4_4_) < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",0x2dc,
           "ref_cell_add_many_global","malloc global of REF_GLOB negative");
    ref_cell_local._4_4_ = 1;
  }
  else {
    _node = (REF_GLOB *)
            malloc((long)(int)(*(int *)&ref_node_local->field_0xc * c2n_local._4_4_) << 3);
    if (_node == (REF_GLOB *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",0x2dc,
             "ref_cell_add_many_global","malloc global of REF_GLOB NULL");
      ref_cell_local._4_4_ = 2;
    }
    else {
      cell = 0;
      for (local_5c = 0; (int)local_5c < (int)c2n_local._4_4_; local_5c = local_5c + 1) {
        for (local = 0; local < *(int *)&ref_node_local->field_0xc; local = local + 1) {
          if (ref_mpi._4_4_ != pRStack_38[(int)(local + ref_node_local->blank * local_5c)]) {
            _node[cell] = *(REF_GLOB *)
                           (part_local + (long)(int)(local + ref_node_local->blank * local_5c) * 2);
            cell = cell + 1;
          }
        }
      }
      uVar1 = ref_node_add_many(pRStack_20,cell,_node);
      if (uVar1 == 0) {
        if (_node != (REF_GLOB *)0x0) {
          free(_node);
        }
        if (10 < (int)global[6]) {
          cVar2 = clock();
          cell_toc = cVar2 - node_toc;
        }
        if (10 < (int)global[6]) {
          node_toc = clock();
        }
        for (local_5c = 0; (int)local_5c < (int)c2n_local._4_4_; local_5c = local_5c + 1) {
          for (local = 0; local < *(int *)&ref_node_local->field_0xc; local = local + 1) {
            uVar1 = ::ref_node_local(pRStack_20,
                                     *(REF_GLOB *)
                                      (part_local +
                                      (long)(int)(local + ref_node_local->blank * local_5c) * 2),
                                     &local_60);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c"
                     ,0x2f3,"ref_cell_add_many_global",(ulong)uVar1,"local");
              printf("node %d %d cell %d %d global %ld\n",(ulong)(uint)local,
                     (ulong)*(uint *)&ref_node_local->field_0xc,(ulong)local_5c,
                     (ulong)c2n_local._4_4_,
                     *(undefined8 *)
                      (part_local + (long)(int)(local + ref_node_local->blank * local_5c) * 2));
              return uVar1;
            }
            pRStack_20->part[local_60] = pRStack_38[(int)(local + ref_node_local->blank * local_5c)]
            ;
            (&local_d8)[local] = local_60;
          }
          if (ref_node_local->max != 0) {
            (&local_d8)[ref_node_local->blank + -1] =
                 (REF_INT)*(undefined8 *)
                           (part_local +
                           (long)(int)(ref_node_local->blank + -1 + ref_node_local->blank * local_5c
                                      ) * 2);
          }
          uVar1 = ref_cell_with((REF_CELL)ref_node_local,&local_d8,(REF_INT *)((long)&tic + 4));
          if ((uVar1 != 0) && (uVar1 != 5)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
                   0x2fd,"ref_cell_add_many_global",(ulong)uVar1,"with failed");
            return uVar1;
          }
          if ((tic._4_4_ == -1) &&
             (uVar1 = ref_cell_add((REF_CELL)ref_node_local,&local_d8,(REF_INT *)((long)&tic + 4)),
             uVar1 != 0)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
                   0x300,"ref_cell_add_many_global",(ulong)uVar1,"add cell");
            return uVar1;
          }
        }
        if (10 < (int)global[6]) {
          cVar2 = clock();
          _ref_private_macro_code_rsb = cVar2 - node_toc;
        }
        if (10 < (int)global[6]) {
          printf(" node %f cell %f\n",(double)cell_toc / 1000000.0,
                 (double)_ref_private_macro_code_rsb / 1000000.0);
        }
        ref_cell_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
               0x2e5,"ref_cell_add_many_global",(ulong)uVar1,"many nodes");
        ref_cell_local._4_4_ = uVar1;
      }
    }
  }
  return ref_cell_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_cell_add_many_global(REF_CELL ref_cell,
                                            REF_NODE ref_node, REF_INT n,
                                            REF_GLOB *c2n, REF_INT *part,
                                            REF_INT exclude_part_id) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_GLOB *global;
  REF_INT nnode;
  REF_INT node, cell;
  REF_INT local, local_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT new_cell;
  clock_t tic = 0;
  clock_t node_toc = 0;
  clock_t cell_toc = 0;

  if (10 < ref_mpi_timing(ref_mpi)) tic = clock();
  ref_malloc(global, ref_cell_node_per(ref_cell) * n, REF_GLOB);

  nnode = 0;
  for (cell = 0; cell < n; cell++)
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (exclude_part_id != part[node + ref_cell_size_per(ref_cell) * cell]) {
        global[nnode] = c2n[node + ref_cell_size_per(ref_cell) * cell];
        nnode++;
      }
  RSS(ref_node_add_many(ref_node, nnode, global), "many nodes");

  ref_free(global);
  if (10 < ref_mpi_timing(ref_mpi)) node_toc += (clock() - tic);
  if (10 < ref_mpi_timing(ref_mpi)) tic = clock();
  /* set parts */
  for (cell = 0; cell < n; cell++) {
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      RSB(ref_node_local(
              ref_node, c2n[node + ref_cell_size_per(ref_cell) * cell], &local),
          "local", {
            printf("node %d %d cell %d %d global " REF_GLOB_FMT "\n", node,
                   ref_cell_node_per(ref_cell), cell, n,
                   c2n[node + ref_cell_size_per(ref_cell) * cell]);
          });
      ref_node_part(ref_node, local) =
          part[node + ref_cell_size_per(ref_cell) * cell];
      local_nodes[node] = local;
    }
    if (ref_cell_last_node_is_an_id(ref_cell))
      local_nodes[ref_cell_size_per(ref_cell) - 1] =
          (REF_INT)c2n[(ref_cell_size_per(ref_cell) - 1) +
                       ref_cell_size_per(ref_cell) * cell];
    RXS(ref_cell_with(ref_cell, local_nodes, &new_cell), REF_NOT_FOUND,
        "with failed");

    if (REF_EMPTY == new_cell)
      RSS(ref_cell_add(ref_cell, local_nodes, &new_cell), "add cell");
  }
  if (10 < ref_mpi_timing(ref_mpi)) cell_toc += (clock() - tic);

  if (10 < ref_mpi_timing(ref_mpi)) {
    printf(" node %f cell %f\n",
           ((REF_DBL)node_toc) / ((REF_DBL)CLOCKS_PER_SEC),
           ((REF_DBL)cell_toc) / ((REF_DBL)CLOCKS_PER_SEC));
  }

  return REF_SUCCESS;
}